

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_man.cpp
# Opt level: O3

bool __thiscall FScanner::GetFloat(FScanner *this)

{
  bool bVar1;
  double dVar2;
  char *stopper;
  char *local_20;
  
  if (this->ScriptOpen == false) {
    I_FatalError("SC_ call before SC_Open().");
  }
  bVar1 = ScanString(this,false);
  if (bVar1) {
    dVar2 = strtod(this->String,&local_20);
    this->Float = dVar2;
    if (*local_20 != '\0') {
      ScriptError(this,"SC_GetFloat: Bad numeric constant \"%s\".",this->String);
      dVar2 = this->Float;
    }
    this->Number = (int)dVar2;
  }
  return bVar1;
}

Assistant:

bool FScanner::GetFloat ()
{
	char *stopper;

	CheckOpen ();
	if (GetString())
	{
		Float = strtod (String, &stopper);
		if (*stopper != 0)
		{
			ScriptError ("SC_GetFloat: Bad numeric constant \"%s\".", String);
		}
		Number = (int)Float;
		return true;
	}
	else
	{
		return false;
	}
}